

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

int Ssc_GiaTransferPiPattern(Gia_Man_t *pAig,Gia_Man_t *pCare,Vec_Int_t *vPivot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  word *pwVar5;
  word *pwVar6;
  int iVar7;
  uint uVar8;
  word *__ptr;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int nWords;
  int iVar14;
  ulong uVar15;
  
  uVar10 = (long)pCare->vSimsPi->nSize / (long)(pCare->vCis->nSize - pCare->nRegs);
  uVar15 = uVar10 & 0xffffffff;
  __ptr = Ssc_GiaGetCareMask(pCare);
  nWords = (int)uVar10;
  if (nWords < 1) {
    iVar14 = 0;
  }
  else {
    uVar10 = 0;
    iVar14 = 0;
    do {
      uVar11 = __ptr[uVar10] - (__ptr[uVar10] >> 1 & 0x5555555555555555);
      uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
      uVar11 = (uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f;
      uVar11 = (uVar11 >> 8) + uVar11;
      lVar12 = (uVar11 >> 0x10) + uVar11;
      iVar14 = iVar14 + ((int)((ulong)lVar12 >> 0x20) + (int)lVar12 & 0xffU);
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
  }
  if (iVar14 == 0) {
    iVar14 = 0;
  }
  else {
    Ssc_GiaResetPiPattern(pAig,nWords);
    iVar1 = pCare->vCis->nSize;
    if (0 < (long)iVar1) {
      piVar4 = pCare->vCis->pArray;
      lVar12 = 0;
      do {
        iVar2 = piVar4[lVar12];
        if ((iVar2 < 0) || (pCare->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pCare->pObjs == (Gia_Obj_t *)0x0) break;
        iVar3 = pAig->vSimsPi->nSize;
        iVar9 = iVar3 / (pAig->vCis->nSize - pAig->nRegs);
        iVar7 = (int)lVar12 * iVar9;
        if ((((iVar7 < 0) || (iVar3 <= iVar7)) ||
            (uVar8 = (pCare->vSimsPi->nSize / (iVar1 - pCare->nRegs)) * iVar2, (int)uVar8 < 0)) ||
           (pCare->vSims->nSize <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < nWords) {
          if (vPivot->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pwVar5 = pAig->vSimsPi->pArray;
          pwVar6 = pCare->vSims->pArray;
          iVar2 = vPivot->pArray[lVar12];
          uVar10 = 0;
          do {
            uVar11 = pwVar6[uVar8 + uVar10];
            uVar13 = __ptr[uVar10] & uVar11;
            if (iVar2 != 0) {
              uVar13 = ~__ptr[uVar10] | uVar11;
            }
            pwVar5[(uint)(iVar9 * (int)lVar12) + uVar10] = uVar13;
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar1);
    }
  }
  if (__ptr != (word *)0x0) {
    free(__ptr);
  }
  return iVar14;
}

Assistant:

int Ssc_GiaTransferPiPattern( Gia_Man_t * pAig, Gia_Man_t * pCare, Vec_Int_t * vPivot )
{
    extern word * Ssc_GiaGetCareMask( Gia_Man_t * p );
    Gia_Obj_t * pObj;
    int i, w, nWords = Gia_ObjSimWords( pCare );
    word * pCareMask = Ssc_GiaGetCareMask( pCare );
    int Count = Ssc_SimCountBits( pCareMask, nWords );
    word * pSimPiCare, * pSimPiAig;
    if ( Count == 0 )
    {
        ABC_FREE( pCareMask );
        return 0;
    }
    Ssc_GiaResetPiPattern( pAig, nWords );
    Gia_ManForEachCi( pCare, pObj, i )
    {
        pSimPiAig  = Gia_ObjSimPi( pAig, i );
        pSimPiCare = Gia_ObjSimObj( pCare, pObj );
        for ( w = 0; w < nWords; w++ )
            if ( Vec_IntEntry(vPivot, i) )
                pSimPiAig[w] = pSimPiCare[w] | ~pCareMask[w];
            else
                pSimPiAig[w] = pSimPiCare[w] & pCareMask[w];
    }
    ABC_FREE( pCareMask );
    return Count;
}